

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

int __thiscall QTemporaryFileEngine::rename(QTemporaryFileEngine *this,char *__old,char *__new)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  char *__new_00;
  
  if (this->unnamedFile == true) {
    bVar1 = materializeUnnamedFile(this,(QString *)__old,DontOverwrite);
    QFSFileEngine::close(&this->super_QFSFileEngine,(int)__old);
    return (int)CONCAT71(extraout_var,bVar1);
  }
  QFSFileEngine::close(&this->super_QFSFileEngine,(int)__old);
  iVar2 = QFSFileEngine::rename(&this->super_QFSFileEngine,__old,__new_00);
  return iVar2;
}

Assistant:

bool QTemporaryFileEngine::rename(const QString &newName)
{
    if (isUnnamedFile()) {
        bool ok = materializeUnnamedFile(newName, DontOverwrite);
        QFSFileEngine::close();
        return ok;
    }
    QFSFileEngine::close();
    return QFSFileEngine::rename(newName);
}